

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::KcpConnection::handleKcpMessage(KcpConnection *this,Buffer *inputBuffer)

{
  ikcpcb *piVar1;
  LogLevel LVar2;
  char *pcVar3;
  size_t sVar4;
  LogStream *pLVar5;
  Timestamp __args_2;
  SourceFile file;
  SourceFile file_00;
  enable_shared_from_this<sznet::net::KcpConnection> local_2008;
  undefined1 local_1ff8 [12];
  Logger local_1fe8;
  undefined1 local_1008 [12];
  Logger local_ff8;
  int local_28;
  int local_24;
  int recvRet;
  int bufferSize;
  long readSize;
  Buffer *inputBuffer_local;
  KcpConnection *this_local;
  
  readSize = (long)inputBuffer;
  inputBuffer_local = (Buffer *)this;
  _recvRet = Buffer::readableBytes(inputBuffer);
  piVar1 = this->m_kcp;
  pcVar3 = Buffer::peek((Buffer *)readSize);
  ikcp_input(piVar1,pcVar3,_recvRet);
  kcpUpdateManual(this);
  sVar4 = Buffer::writableBytes(&this->m_inputBuffer);
  local_24 = (int)sVar4;
  piVar1 = this->m_kcp;
  pcVar3 = Buffer::beginWrite(&this->m_inputBuffer);
  local_28 = ikcp_recv(piVar1,pcVar3,local_24);
  if (local_28 < 0) {
    if ((local_28 == -1) || (local_28 == -2)) {
      LVar2 = Logger::logLevel();
      if ((int)LVar2 < 1) {
        Logger::SourceFile::SourceFile<104>
                  ((SourceFile *)local_1008,
                   (char (*) [104])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                  );
        file._12_4_ = 0;
        file.m_data = (char *)local_1008._0_8_;
        file.m_size = local_1008._8_4_;
        Logger::Logger(&local_ff8,file,0x183,TRACE,"handleKcpMessage");
        pLVar5 = Logger::stream(&local_ff8);
        LogStream::operator<<(pLVar5,"ikcp_recv EAGAIN ");
        Logger::~Logger(&local_ff8);
      }
    }
    else {
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_1ff8,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_1ff8._0_8_;
      file_00.m_size = local_1ff8._8_4_;
      Logger::Logger(&local_1fe8,file_00,0x187,ERROR);
      pLVar5 = Logger::stream(&local_1fe8);
      LogStream::operator<<(pLVar5,"ikcp_recv recv buffer size not enough");
      Logger::~Logger(&local_1fe8);
    }
  }
  else {
    Buffer::hasWritten(&this->m_inputBuffer,(long)local_28);
    std::enable_shared_from_this<sznet::net::KcpConnection>::shared_from_this(&local_2008);
    __args_2 = Timestamp::now();
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::operator()(&this->m_kcpMessageCallback,(shared_ptr<sznet::net::KcpConnection> *)&local_2008,
                 &this->m_inputBuffer,__args_2);
    std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::KcpConnection> *)&local_2008);
  }
  return;
}

Assistant:

void KcpConnection::handleKcpMessage(Buffer& inputBuffer)
{
	long readSize = static_cast<long>(inputBuffer.readableBytes());
	ikcp_input(m_kcp, inputBuffer.peek(), readSize);
	kcpUpdateManual();
	int bufferSize = static_cast<int>(m_inputBuffer.writableBytes());
	int recvRet = ikcp_recv(m_kcp, m_inputBuffer.beginWrite(), bufferSize);
	if (recvRet < 0)
	{
		// https://github.com/skywind3000/kcp/issues/39
		// -1 ������ȫû�����ݣ����������� EAGAIN
		// -2 �������ݲ�ȫ����Ҫ�������ݲ�����Ϊһ������������Ҳ���������� EAGAIN
		// -3 �����㴫���Ļ��泤�Ȳ���
		if (recvRet == -1 || recvRet == -2)
		{
			LOG_TRACE << "ikcp_recv EAGAIN ";
		}
		else
		{
			LOG_ERROR << "ikcp_recv recv buffer size not enough";
		}
		return;
	}
	m_inputBuffer.hasWritten(static_cast<size_t>(recvRet));
	// ��������
	m_kcpMessageCallback(shared_from_this(), &m_inputBuffer, Timestamp::now());
}